

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::animationFinished(QMainWindowLayout *this,QWidget *widget)

{
  bool bVar1;
  QToolBar *pQVar2;
  QToolBarLayout *pQVar3;
  QDockWidgetGroupWindow *pQVar4;
  QDockAreaLayoutInfo *pQVar5;
  reference pQVar6;
  QMainWindowLayout *this_00;
  QDockWidget *pQVar7;
  QWidget *this_01;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  insert_iterator<QList<QDockAreaLayoutItem>_> iVar8;
  QTabBar *tab_bar;
  QSet<QTabBar_*> *__range2;
  QDockAreaLayoutInfo *info;
  QToolBar *tb_1;
  QDockWidget *dw;
  QDockAreaLayoutItem *item;
  quintptr currentId;
  int idx;
  QDockAreaLayoutInfo *dstParentInfo;
  QDockAreaLayoutInfo *srcTabInfo;
  QDockAreaLayoutInfo *srcInfo;
  QDockWidgetGroupWindow *dwgw;
  QToolBarLayout *tbl;
  QToolBar *tb;
  const_iterator __end2;
  const_iterator __begin2;
  QSet<QTabBar_*> usedTabBarsCopy;
  QList<int> dstPath;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  QMainWindowLayoutState *in_stack_fffffffffffffd70;
  QDockWidgetGroupWindow *in_stack_fffffffffffffd78;
  QDockAreaLayoutInfo *in_stack_fffffffffffffd80;
  iterator in_stack_fffffffffffffd88;
  QDockAreaLayout *in_stack_fffffffffffffd90;
  QDockAreaLayout *in_stack_fffffffffffffd98;
  QWidget *in_stack_fffffffffffffda0;
  QMainWindowLayout *in_stack_fffffffffffffda8;
  QMainWindowLayout *in_stack_fffffffffffffdb0;
  _Iter in_stack_fffffffffffffdb8;
  const_iterator __last;
  const_iterator in_stack_fffffffffffffdc8;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe00;
  QDockWidgetGroupWindow *in_stack_fffffffffffffe28;
  QDockAreaLayoutInfo *local_1b0;
  QSize *in_stack_fffffffffffffea0;
  QToolBarLayout *in_stack_fffffffffffffea8;
  QRegion local_148;
  QDockAreaLayoutItem *local_140;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  QSize local_f0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = qobject_cast<QToolBar*>((QObject *)0x5fabf6);
  if (pQVar2 != (QToolBar *)0x0) {
    QWidget::layout((QWidget *)0x5fac1a);
    pQVar3 = qobject_cast<QToolBarLayout*>((QObject *)0x5fac22);
    if (((pQVar3->super_QLayout).super_QLayoutItem.field_0xd & 1) != 0) {
      (pQVar3->super_QLayout).super_QLayoutItem.field_0xd = 0;
      if (((pQVar3->super_QLayout).super_QLayoutItem.field_0xc & 1) != 0) {
        local_f0 = QWidget::size((QWidget *)
                                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        QToolBarLayout::layoutActions(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        in_stack_fffffffffffffdc8.i = (QDockAreaLayoutItem *)pQVar3;
      }
      QWidget::update((QWidget *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    }
  }
  if (in_RSI == *(long *)(in_RDI + 0x7d8)) {
    pQVar4 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5facbc);
    if (pQVar4 != (QDockWidgetGroupWindow *)0x0) {
      QMainWindowLayoutState::clear
                ((QMainWindowLayoutState *)
                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5facf1);
      pQVar5 = QDockWidgetGroupWindow::tabLayoutInfo
                         ((QDockWidgetGroupWindow *)in_stack_fffffffffffffd98);
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      QList<int>::QList((QList<int> *)0x5fad5a);
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5fad6b);
      if (bVar1) {
        QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fad85);
        QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fad8d);
        QDockAreaLayoutInfo::indexOf
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        QList<int>::operator=
                  ((QList<int> *)in_stack_fffffffffffffd70,
                   (QList<int> *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        QList<int>::~QList((QList<int> *)0x5fadc7);
        QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5fadd8);
        QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5fade0);
        local_1b0 = QDockAreaLayoutInfo::info
                              ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd98,
                               (QList<int> *)in_stack_fffffffffffffd90);
      }
      else {
        QDockAreaLayout::indexOf(in_stack_fffffffffffffd98,(QWidget *)in_stack_fffffffffffffd90);
        QList<int>::operator=
                  ((QList<int> *)in_stack_fffffffffffffd70,
                   (QList<int> *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        QList<int>::~QList((QList<int> *)0x5fae44);
        local_1b0 = QDockAreaLayout::info
                              ((QDockAreaLayout *)in_stack_fffffffffffffd88.i,
                               (QList<int> *)in_stack_fffffffffffffd80);
      }
      QList<int>::constLast
                ((QList<int> *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      if (((local_1b0->tabbed & 1U) == 0) || (pQVar5 == (QDockAreaLayoutInfo *)0x0)) {
        pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                           ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd70,
                            CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        in_stack_fffffffffffffda0 = (QWidget *)pQVar6->widgetItem;
        if (in_stack_fffffffffffffda0 != (QWidget *)0x0) {
          (**(code **)(*(long *)in_stack_fffffffffffffda0 + 8))();
        }
        pQVar6->widgetItem = (QLayoutItem *)0x0;
        in_stack_fffffffffffffd90 = (QDockAreaLayout *)operator_new(0x70);
        QDockAreaLayoutInfo::QDockAreaLayoutInfo
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70,
                   (QDockAreaLayoutInfo *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        pQVar6->subinfo = (QDockAreaLayoutInfo *)in_stack_fffffffffffffd90;
        QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70);
        QDockAreaLayoutInfo::operator=
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70,
                   (QDockAreaLayoutInfo *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70);
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5fb167);
        if (bVar1) {
          in_stack_fffffffffffffd88.i =
               (QDockAreaLayoutItem *)
               QPointer<QDockWidgetGroupWindow>::data((QPointer<QDockWidgetGroupWindow> *)0x5fb17e);
        }
        else {
          in_stack_fffffffffffffd88.i =
               (QDockAreaLayoutItem *)QLayout::parentWidget((QLayout *)in_stack_fffffffffffffd80);
        }
        QDockAreaLayoutInfo::reparentWidgets
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffdb0,
                   (QWidget *)in_stack_fffffffffffffda8);
        QDockAreaLayoutInfo::setTabBarShape
                  (in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
      }
      else {
        pQVar6 = QList<QDockAreaLayoutItem>::operator[]
                           ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd70,
                            CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        __last.i = (QDockAreaLayoutItem *)pQVar6->widgetItem;
        if (__last.i != (QDockAreaLayoutItem *)0x0) {
          (**(code **)&(__last.i)->widgetItem->align)();
        }
        QList<QDockAreaLayoutItem>::removeAt
                  ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd70,
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        QList<QDockAreaLayoutItem>::cbegin((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd70);
        QList<QDockAreaLayoutItem>::cend((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd70);
        in_stack_fffffffffffffdb0 = (QMainWindowLayout *)&local_1b0->item_list;
        local_140 = (QDockAreaLayoutItem *)
                    QList<QDockAreaLayoutItem>::begin
                              ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd70);
        QList<QDockAreaLayoutItem>::iterator::operator+
                  ((iterator *)in_stack_fffffffffffffd70,
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        iVar8 = std::inserter<QList<QDockAreaLayoutItem>>
                          ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffd78,
                           in_stack_fffffffffffffd88);
        in_stack_fffffffffffffe28 = (QDockWidgetGroupWindow *)iVar8.container;
        iVar8.iter.i = in_stack_fffffffffffffdb8.i;
        iVar8.container = (QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffdb0;
        std::
        copy<QList<QDockAreaLayoutItem>::const_iterator,std::insert_iterator<QList<QDockAreaLayoutItem>>>
                  (in_stack_fffffffffffffdc8,__last,iVar8);
        QDockAreaLayoutInfo::currentTabId(in_stack_fffffffffffffd80);
        QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70);
        QDockAreaLayoutInfo::operator=
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70,
                   (QDockAreaLayoutInfo *)
                   CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        QDockAreaLayoutInfo::~QDockAreaLayoutInfo((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70);
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5fb020);
        if (bVar1) {
          in_stack_fffffffffffffda8 =
               (QMainWindowLayout *)
               QPointer<QDockWidgetGroupWindow>::data((QPointer<QDockWidgetGroupWindow> *)0x5fb037);
        }
        else {
          in_stack_fffffffffffffda8 =
               (QMainWindowLayout *)QLayout::parentWidget((QLayout *)in_stack_fffffffffffffd80);
        }
        QDockAreaLayoutInfo::reparentWidgets
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffdb0,
                   (QWidget *)in_stack_fffffffffffffda8);
        QDockAreaLayoutInfo::updateTabBar(in_stack_fffffffffffffe00);
        QDockAreaLayoutInfo::setCurrentTabId
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd98,
                   (quintptr)in_stack_fffffffffffffd90);
      }
      QDockWidgetGroupWindow::destroyOrHideIfEmpty
                ((QDockWidgetGroupWindow *)in_stack_fffffffffffffdc8.i);
      QList<int>::~QList((QList<int> *)0x5fb1d9);
    }
    pQVar5 = (QDockAreaLayoutInfo *)qobject_cast<QDockWidget*>((QObject *)0x5fb1e6);
    if (pQVar5 != (QDockAreaLayoutInfo *)0x0) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5fb21b);
      if (bVar1) {
        in_stack_fffffffffffffd78 =
             QPointer<QDockWidgetGroupWindow>::data((QPointer<QDockWidgetGroupWindow> *)0x5fb232);
        in_stack_fffffffffffffd80 = pQVar5;
      }
      else {
        in_stack_fffffffffffffd78 =
             (QDockWidgetGroupWindow *)QLayout::parentWidget((QLayout *)pQVar5);
        in_stack_fffffffffffffd80 = pQVar5;
      }
      QWidget::setParent((QWidget *)in_stack_fffffffffffffd90,(QWidget *)in_stack_fffffffffffffd88.i
                        );
      QWidget::show((QWidget *)in_stack_fffffffffffffd80);
      QDockWidget::d_func((QDockWidget *)0x5fb271);
      QDockWidgetPrivate::plug
                ((QDockWidgetPrivate *)in_stack_fffffffffffffd70,
                 (QRect *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    }
    this_00 = (QMainWindowLayout *)qobject_cast<QToolBar*>((QObject *)0x5fb292);
    if (this_00 != (QMainWindowLayout *)0x0) {
      QToolBar::d_func((QToolBar *)0x5fb2b2);
      QToolBarPrivate::plug
                ((QToolBarPrivate *)in_stack_fffffffffffffd70,
                 (QRect *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    }
    QMainWindowLayoutState::clear
              ((QMainWindowLayoutState *)
               CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    QList<int>::clear((QList<int> *)in_stack_fffffffffffffd70);
    *(undefined8 *)(in_RDI + 0x7d8) = 0;
    setCurrentHoveredFloat(this_00,in_stack_fffffffffffffe28);
    QMainWindowLayoutState::apply(in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
    pQVar7 = qobject_cast<QDockWidget*>((QObject *)0x5fb321);
    if ((pQVar7 != (QDockWidget *)0x0) &&
       (pQVar5 = dockInfo(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0),
       pQVar5 != (QDockAreaLayoutInfo *)0x0)) {
      QDockAreaLayoutInfo::setCurrentTab
                ((QDockAreaLayoutInfo *)in_stack_fffffffffffffd70,
                 (QWidget *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    }
  }
  bVar1 = QWidgetAnimator::animating((QWidgetAnimator *)0x5fb376);
  if (!bVar1) {
    this_01 = QLayout::parentWidget((QLayout *)in_stack_fffffffffffffd80);
    QDockAreaLayout::separatorRegion(in_stack_fffffffffffffd90);
    QWidget::update((QWidget *)in_stack_fffffffffffffd80,(QRegion *)in_stack_fffffffffffffd78);
    QRegion::~QRegion(&local_148);
    QSet<QTabBar_*>::QSet
              ((QSet<QTabBar_*> *)this_01,
               (QSet<QTabBar_*> *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    QSet<QTabBar_*>::begin((QSet<QTabBar_*> *)in_stack_fffffffffffffd88.i);
    QSet<QTabBar_*>::end((QSet<QTabBar_*> *)in_stack_fffffffffffffd88.i);
    while (bVar1 = QSet<QTabBar_*>::const_iterator::operator!=
                             ((const_iterator *)this_01,
                              (const_iterator *)
                              CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68)), bVar1)
    {
      QSet<QTabBar_*>::const_iterator::operator*((const_iterator *)0x5fb498);
      QWidget::show((QWidget *)in_stack_fffffffffffffd80);
      QSet<QTabBar_*>::const_iterator::operator++((const_iterator *)this_01);
    }
    QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x5fb4c6);
  }
  updateGapIndicator(in_stack_fffffffffffffdb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::animationFinished(QWidget *widget)
{
    //this function is called from within the Widget Animator whenever an animation is finished
    //on a certain widget
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(tb->layout());
        if (tbl->animating) {
            tbl->animating = false;
            if (tbl->expanded)
                tbl->layoutActions(tb->size());
            tb->update();
        }
    }
#endif

    if (widget == pluggingWidget) {

#if QT_CONFIG(dockwidget)
#if QT_CONFIG(tabbar)
        if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            // When the animated widget was a QDockWidgetGroupWindow, it means each of the
            // embedded QDockWidget needs to be plugged back into the QMainWindow layout.
            savedState.clear();
            QDockAreaLayoutInfo *srcInfo = dwgw->layoutInfo();
            const QDockAreaLayoutInfo *srcTabInfo = dwgw->tabLayoutInfo();
            QDockAreaLayoutInfo *dstParentInfo;
            QList<int> dstPath;

            if (currentHoveredFloat) {
                dstPath = currentHoveredFloat->layoutInfo()->indexOf(widget);
                Q_ASSERT(dstPath.size() >= 1);
                dstParentInfo = currentHoveredFloat->layoutInfo()->info(dstPath);
            } else {
                dstPath = layoutState.dockAreaLayout.indexOf(widget);
                Q_ASSERT(dstPath.size() >= 2);
                dstParentInfo = layoutState.dockAreaLayout.info(dstPath);
            }
            Q_ASSERT(dstParentInfo);
            int idx = dstPath.constLast();
            Q_ASSERT(dstParentInfo->item_list[idx].widgetItem->widget() == dwgw);
            if (dstParentInfo->tabbed && srcTabInfo) {
                // merge the two tab widgets
                delete dstParentInfo->item_list[idx].widgetItem;
                dstParentInfo->item_list.removeAt(idx);
                std::copy(srcTabInfo->item_list.cbegin(), srcTabInfo->item_list.cend(),
                          std::inserter(dstParentInfo->item_list,
                                        dstParentInfo->item_list.begin() + idx));
                quintptr currentId = srcTabInfo->currentTabId();
                *srcInfo = QDockAreaLayoutInfo();
                dstParentInfo->reparentWidgets(currentHoveredFloat ? currentHoveredFloat.data()
                                                                   : parentWidget());
                dstParentInfo->updateTabBar();
                dstParentInfo->setCurrentTabId(currentId);
            } else {
                QDockAreaLayoutItem &item = dstParentInfo->item_list[idx];
                Q_ASSERT(item.widgetItem->widget() == dwgw);
                delete item.widgetItem;
                item.widgetItem = nullptr;
                item.subinfo = new QDockAreaLayoutInfo(std::move(*srcInfo));
                *srcInfo = QDockAreaLayoutInfo();
                item.subinfo->reparentWidgets(currentHoveredFloat ? currentHoveredFloat.data()
                                                                  : parentWidget());
                item.subinfo->setTabBarShape(dstParentInfo->tabBarShape);
            }
            dwgw->destroyOrHideIfEmpty();
        }
#endif

        if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
            dw->setParent(currentHoveredFloat ? currentHoveredFloat.data() : parentWidget());
            dw->show();
            dw->d_func()->plug(currentGapRect);
        }
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            tb->d_func()->plug(currentGapRect);
#endif

        savedState.clear();
        currentGapPos.clear();
        pluggingWidget = nullptr;
#if QT_CONFIG(dockwidget)
        setCurrentHoveredFloat(nullptr);
#endif
        //applying the state will make sure that the currentGap is updated correctly
        //and all the geometries (especially the one from the central widget) is correct
        layoutState.apply(false);

#if QT_CONFIG(dockwidget)
#if QT_CONFIG(tabbar)
        if (qobject_cast<QDockWidget*>(widget) != nullptr) {
            // info() might return null if the widget is destroyed while
            // animating but before the animationFinished signal is received.
            if (QDockAreaLayoutInfo *info = dockInfo(widget))
                info->setCurrentTab(widget);
        }
#endif
#endif
    }

    if (!widgetAnimator.animating()) {
        //all animations are finished
#if QT_CONFIG(dockwidget)
        parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#if QT_CONFIG(tabbar)
        const auto usedTabBarsCopy = usedTabBars; // list potentially modified by animations
        for (QTabBar *tab_bar : usedTabBarsCopy)
            tab_bar->show();
#endif // QT_CONFIG(tabbar)
#endif // QT_CONFIG(dockwidget)
    }

    updateGapIndicator();
}